

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_schematron(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr pxVar3;
  int test_ret;
  uint uVar4;
  int n_instance;
  uint no;
  xmlDocPtr in_RSI;
  
  if (quiet == '\0') {
    puts("Testing schematron : 1 of 10 functions ...");
  }
  no = 0;
  uVar4 = 0;
  do {
    iVar2 = (int)in_RSI;
    iVar1 = xmlMemBlocks();
    pxVar3 = gen_xmlDocPtr(no,iVar2);
    in_RSI = pxVar3;
    xmlSchematronValidateDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar3 != (xmlDocPtr)0x0) && (api_doc != pxVar3)) && (pxVar3->doc != api_doc)) {
      xmlFreeDoc(pxVar3);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchematronValidateDoc",(ulong)(uint)(iVar2 - iVar1));
      uVar4 = uVar4 + 1;
      printf(" %d",0);
      in_RSI = (xmlDocPtr)(ulong)no;
      printf(" %d");
      putchar(10);
    }
    no = no + 1;
  } while (no != 4);
  function_tests = function_tests + 1;
  if (uVar4 != 0) {
    printf("Module schematron: %d errors\n",(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

static int
test_schematron(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing schematron : 1 of 10 functions ...\n");
    test_ret += test_xmlSchematronNewDocParserCtxt();
    test_ret += test_xmlSchematronNewMemParserCtxt();
    test_ret += test_xmlSchematronNewParserCtxt();
    test_ret += test_xmlSchematronNewValidCtxt();
    test_ret += test_xmlSchematronParse();
    test_ret += test_xmlSchematronSetValidStructuredErrors();
    test_ret += test_xmlSchematronValidateDoc();

    if (test_ret != 0)
	printf("Module schematron: %d errors\n", test_ret);
    return(test_ret);
}